

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpsClient.cpp
# Opt level: O0

void __thiscall xmrig::HttpsClient::handshake(HttpsClient *this)

{
  SSL *pSVar1;
  String *this_00;
  char *parg;
  long in_RDI;
  HttpsClient *unaff_retaddr;
  
  pSVar1 = SSL_new(*(SSL_CTX **)(in_RDI + 0x970));
  *(SSL **)(in_RDI + 0x968) = pSVar1;
  if (*(long *)(in_RDI + 0x968) != 0) {
    SSL_set_connect_state(*(SSL **)(in_RDI + 0x968));
    SSL_set_bio(*(SSL **)(in_RDI + 0x968),*(BIO **)(in_RDI + 0x108),*(BIO **)(in_RDI + 0x110));
    pSVar1 = *(SSL **)(in_RDI + 0x968);
    this_00 = HttpClient::host((HttpClient *)0x276cbf);
    parg = String::data(this_00);
    SSL_ctrl(pSVar1,0x37,0,parg);
    SSL_do_handshake(*(SSL **)(in_RDI + 0x968));
    flush(unaff_retaddr);
  }
  return;
}

Assistant:

void xmrig::HttpsClient::handshake()
{
    m_ssl = SSL_new(m_ctx);
    assert(m_ssl != nullptr);

    if (!m_ssl) {
        return;
    }

    SSL_set_connect_state(m_ssl);
    SSL_set_bio(m_ssl, m_readBio, m_writeBio);
    SSL_set_tlsext_host_name(m_ssl, host().data());

    SSL_do_handshake(m_ssl);

    flush();
}